

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O3

int __thiscall
ki::dml::Field<signed_char>::clone
          (Field<signed_char> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  pointer pcVar1;
  Field<signed_char> *this_00;
  string local_38;
  
  this_00 = (Field<signed_char> *)operator_new(0x40);
  pcVar1 = (this->super_FieldBase).m_name._M_dataplus._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + (this->super_FieldBase).m_name._M_string_length);
  Field(this_00,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  (this_00->super_FieldBase).m_transferable = (this->super_FieldBase).m_transferable;
  this_00->m_value = this->m_value;
  return (int)this_00;
}

Assistant:

Field<ValueT> *clone() const override final
		{
			auto *clone = new Field<ValueT>(m_name);
			clone->m_transferable = m_transferable;
			clone->m_value = m_value;
			return clone;
		}